

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

optional<int32_t> __thiscall
Commands::find_constant(Commands *this,string_view *value,bool context_free_only)

{
  bool bVar1;
  reference ppVar2;
  element_type *peVar3;
  byte in_CL;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>
  *enum_pair;
  const_iterator __end1;
  const_iterator __begin1;
  transparent_map<std::string,_shared_ptr<Enum>_> *__range1;
  bool context_free_only_local;
  string_view *value_local;
  Commands *this_local;
  optional<int32_t> *opt;
  
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>_>_>
                    *)(value + 9));
  enum_pair = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>_>_>
                        *)(value + 9));
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&enum_pair);
    if (!bVar1) {
      std::experimental::optional<int>::optional((optional<int> *)this);
      return (optional<int32_t>)(OptionalBase<int>)this;
    }
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>_>
             ::operator*(&__end1);
    peVar3 = std::__shared_ptr_access<Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &ppVar2->second);
    if ((peVar3->is_global & 1U) == (in_CL & 1)) {
      peVar3 = std::__shared_ptr_access<Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &ppVar2->second);
      Enum::find((Enum *)this,(string_view *)peVar3);
      bVar1 = std::experimental::optional::operator_cast_to_bool((optional *)this);
      if (bVar1) {
        return (optional<int32_t>)(OptionalBase<int>)this;
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

optional<int32_t> Commands::find_constant(const string_view& value, bool context_free_only) const
{
    for(auto& enum_pair : enums)
    {
        if(enum_pair.second->is_global == context_free_only)
        {
            if(auto opt = enum_pair.second->find(value))
                return opt;
        }
    }
    return nullopt;
}